

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph.h
# Opt level: O3

hpdata_t * duckdb_je_hpdata_age_heap_first(hpdata_age_heap_t *ph)

{
  hpdata_t *phVar1;
  hpdata_t *phVar2;
  hpdata_t *phVar3;
  hpdata_t *phVar4;
  hpdata_t *phVar5;
  hpdata_t *phVar6;
  hpdata_t *phVar7;
  uint64_t a_age_1;
  
  phVar1 = (hpdata_t *)(ph->ph).root;
  if (phVar1 != (hpdata_t *)0x0) {
    (ph->ph).auxcount = 0;
    phVar6 = (phVar1->field_13).ql_link_empty.qre_prev;
    if (phVar6 != (hpdata_t *)0x0) {
      (phVar1->field_13).age_link.link.prev = (void *)0x0;
      (phVar1->field_13).age_link.link.next = (void *)0x0;
      (phVar6->field_13).age_link.link.prev = (void *)0x0;
      phVar7 = (phVar6->field_13).ql_link_empty.qre_prev;
      if (phVar7 != (hpdata_t *)0x0) {
        phVar2 = (phVar7->field_13).ql_link_empty.qre_prev;
        if (phVar2 != (hpdata_t *)0x0) {
          (phVar2->field_13).age_link.link.prev = (void *)0x0;
        }
        (phVar6->field_13).age_link.link.prev = (void *)0x0;
        (phVar6->field_13).age_link.link.next = (void *)0x0;
        (phVar7->field_13).age_link.link.prev = (void *)0x0;
        (phVar7->field_13).age_link.link.next = (void *)0x0;
        if (phVar6->h_age < phVar7->h_age) {
          (phVar7->field_13).ql_link_empty.qre_next = phVar6;
          phVar5 = (hpdata_t *)(phVar6->field_13).age_link.link.lchild;
          (phVar7->field_13).ql_link_empty.qre_prev = phVar5;
          if (phVar5 != (hpdata_t *)0x0) {
            (phVar5->field_13).ql_link_empty.qre_next = phVar7;
          }
          (phVar6->field_13).age_link.link.lchild = phVar7;
          phVar7 = phVar6;
          phVar5 = phVar6;
        }
        else {
          (phVar6->field_13).ql_link_empty.qre_next = phVar7;
          phVar5 = (hpdata_t *)(phVar7->field_13).age_link.link.lchild;
          (phVar6->field_13).ql_link_empty.qre_prev = phVar5;
          if (phVar5 != (hpdata_t *)0x0) {
            (phVar5->field_13).ql_link_empty.qre_next = phVar6;
          }
          (phVar7->field_13).age_link.link.lchild = phVar6;
          phVar5 = phVar7;
        }
        while (phVar2 != (hpdata_t *)0x0) {
          phVar6 = (phVar2->field_13).ql_link_empty.qre_prev;
          if (phVar6 == (hpdata_t *)0x0) {
            (phVar7->field_13).ql_link_empty.qre_prev = phVar2;
            phVar7 = phVar2;
            break;
          }
          phVar3 = (phVar6->field_13).ql_link_empty.qre_prev;
          if (phVar3 != (hpdata_t *)0x0) {
            (phVar3->field_13).age_link.link.prev = (void *)0x0;
          }
          (phVar2->field_13).age_link.link.prev = (void *)0x0;
          (phVar2->field_13).age_link.link.next = (void *)0x0;
          (phVar6->field_13).age_link.link.prev = (void *)0x0;
          (phVar6->field_13).age_link.link.next = (void *)0x0;
          if (phVar2->h_age < phVar6->h_age) {
            (phVar6->field_13).ql_link_empty.qre_next = phVar2;
            phVar4 = (hpdata_t *)(phVar2->field_13).age_link.link.lchild;
            (phVar6->field_13).ql_link_empty.qre_prev = phVar4;
            if (phVar4 != (hpdata_t *)0x0) {
              (phVar4->field_13).ql_link_empty.qre_next = phVar6;
            }
            (phVar2->field_13).age_link.link.lchild = phVar6;
            phVar6 = phVar2;
          }
          else {
            (phVar2->field_13).ql_link_empty.qre_next = phVar6;
            phVar4 = (hpdata_t *)(phVar6->field_13).age_link.link.lchild;
            (phVar2->field_13).ql_link_empty.qre_prev = phVar4;
            if (phVar4 != (hpdata_t *)0x0) {
              (phVar4->field_13).ql_link_empty.qre_next = phVar2;
            }
            (phVar6->field_13).age_link.link.lchild = phVar2;
          }
          (phVar7->field_13).ql_link_empty.qre_prev = phVar6;
          phVar2 = phVar3;
          phVar7 = phVar6;
        }
        phVar2 = (phVar5->field_13).ql_link_empty.qre_prev;
        phVar6 = phVar5;
        if (phVar2 != (hpdata_t *)0x0) {
          while( true ) {
            phVar6 = phVar2;
            phVar2 = (phVar6->field_13).ql_link_empty.qre_prev;
            (phVar5->field_13).age_link.link.next = (void *)0x0;
            (phVar6->field_13).age_link.link.next = (void *)0x0;
            if (phVar5->h_age < phVar6->h_age) {
              (phVar6->field_13).ql_link_empty.qre_next = phVar5;
              phVar3 = (hpdata_t *)(phVar5->field_13).age_link.link.lchild;
              (phVar6->field_13).ql_link_empty.qre_prev = phVar3;
              if (phVar3 != (hpdata_t *)0x0) {
                (phVar3->field_13).ql_link_empty.qre_next = phVar6;
              }
              (phVar5->field_13).age_link.link.lchild = phVar6;
              phVar6 = phVar5;
            }
            else {
              (phVar5->field_13).ql_link_empty.qre_next = phVar6;
              phVar3 = (hpdata_t *)(phVar6->field_13).age_link.link.lchild;
              (phVar5->field_13).ql_link_empty.qre_prev = phVar3;
              if (phVar3 != (hpdata_t *)0x0) {
                (phVar3->field_13).ql_link_empty.qre_next = phVar5;
              }
              (phVar6->field_13).age_link.link.lchild = phVar5;
            }
            if (phVar2 == (hpdata_t *)0x0) break;
            (phVar7->field_13).ql_link_empty.qre_prev = phVar6;
            phVar5 = phVar2;
            phVar7 = phVar6;
            phVar2 = (phVar2->field_13).ql_link_empty.qre_prev;
          }
        }
      }
      (phVar6->field_13).ql_link_empty.qre_next = phVar1;
      phVar7 = (hpdata_t *)(phVar1->field_13).age_link.link.lchild;
      (phVar6->field_13).ql_link_empty.qre_prev = phVar7;
      if (phVar7 != (hpdata_t *)0x0) {
        (phVar7->field_13).ql_link_empty.qre_next = phVar6;
      }
      (phVar1->field_13).age_link.link.lchild = phVar6;
    }
  }
  return phVar1;
}

Assistant:

JEMALLOC_ALWAYS_INLINE void *
ph_first(ph_t *ph, size_t offset, ph_cmp_t cmp) {
	if (ph->root == NULL) {
		return NULL;
	}
	ph_merge_aux(ph, offset, cmp);
	return ph->root;
}